

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O0

void __thiscall benchmark::walltime::anon_unknown_1::WallTimeImp::WallTimeImp(WallTimeImp *this)

{
  undefined8 uVar1;
  double extraout_RDX;
  double extraout_RDX_00;
  undefined4 extraout_var;
  WallTime *in_RDI;
  double dVar2;
  WallTime WVar3;
  double kMaxErrorInterval;
  uint64_t high_1;
  uint64_t low_1;
  uint64_t high;
  uint64_t low;
  float in_stack_ffffffffffffff9c;
  WallTimeImp *in_stack_ffffffffffffffa0;
  WallTime *pWVar4;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  uint7 in_stack_ffffffffffffffc0;
  byte bVar5;
  WallTimeImp local_38;
  ulong local_8;
  
  *in_RDI = 0.0;
  in_RDI[1] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  *(undefined4 *)(in_RDI + 4) = 0;
  std::atomic<int>::atomic
            ((atomic<int> *)in_stack_ffffffffffffffa0,(__integral_type)in_stack_ffffffffffffff9c);
  in_RDI[5] = 0.0;
  local_38.base_cycletime_ = 0x3f1a36e2eb1c432d;
  dVar2 = CyclesPerSecond();
  in_RDI[2] = (WallTime)(long)dVar2;
  bVar5 = 0;
  if (in_RDI[2] == 0.0) {
    in_stack_ffffffffffffffa0 = &local_38;
    internal::CheckHandler::CheckHandler
              ((CheckHandler *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0,(char *)in_RDI,
               (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    bVar5 = 1;
    internal::CheckHandler::GetLog((CheckHandler *)in_stack_ffffffffffffffa0);
    dVar2 = extraout_RDX_00;
  }
  else {
    internal::GetNullLogInstance();
    dVar2 = extraout_RDX;
  }
  if ((bVar5 & 1) == 0) {
    in_RDI[3] = 1.0 / (double)(long)in_RDI[2];
    in_RDI[5] = (WallTime)(long)((double)(long)in_RDI[2] * 0.0001);
    pWVar4 = in_RDI;
    do {
      uVar1 = rdtsc();
      local_38.max_interval_cycles_ =
           CONCAT44((int)((ulong)dVar2 >> 0x20),(int)((ulong)uVar1 >> 0x20));
      local_8 = CONCAT44((int)((ulong)in_RDI >> 0x20),(int)uVar1);
      pWVar4[1] = (WallTime)(local_38.max_interval_cycles_ << 0x20 | local_8);
      WVar3 = Slow(in_stack_ffffffffffffffa0);
      *pWVar4 = WVar3;
      uVar1 = rdtsc();
      dVar2 = (double)CONCAT44(extraout_var,(int)((ulong)uVar1 >> 0x20));
      local_38._32_8_ = CONCAT44((int)((ulong)pWVar4 >> 0x20),(int)uVar1);
      in_RDI = (WallTime *)(((long)dVar2 << 0x20 | local_38._32_8_) - (long)pWVar4[1]);
      local_38.seconds_per_cycle_ = dVar2;
    } while ((long)pWVar4[5] < (long)in_RDI);
    SetDrift(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *(int *)(pWVar4 + 4) = (int)((ulong)pWVar4[1] >> 0x20);
    return;
  }
  internal::CheckHandler::~CheckHandler((CheckHandler *)&LAB_0017f1a8);
}

Assistant:

WallTimeImp::WallTimeImp()
    : base_walltime_(0.0), base_cycletime_(0),
      cycles_per_second_(0), seconds_per_cycle_(0.0),
      last_adjust_time_(0), drift_adjust_(0),
      max_interval_cycles_(0) {
  const double kMaxErrorInterval = 100e-6;
  cycles_per_second_ = static_cast<int64_t>(CyclesPerSecond());
  CHECK(cycles_per_second_ != 0);
  seconds_per_cycle_ = 1.0 / cycles_per_second_;
  max_interval_cycles_ =
      static_cast<int64_t>(cycles_per_second_ * kMaxErrorInterval);
  do {
    base_cycletime_ = cycleclock::Now();
    base_walltime_ = Slow();
  } while (cycleclock::Now() - base_cycletime_ > max_interval_cycles_);
  // We are now sure that "base_walltime" and "base_cycletime" were produced
  // within kMaxErrorInterval of one another.

  SetDrift(0.0);
  last_adjust_time_ = static_cast<uint32_t>(uint64_t(base_cycletime_) >> 32);
}